

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O2

void __thiscall VariationalBayesEstimatorOnLDA::updateNEx(VariationalBayesEstimatorOnLDA *this)

{
  uint uVar1;
  uint uVar2;
  pointer pvVar3;
  pointer pvVar4;
  pointer pvVar5;
  long lVar6;
  pointer puVar7;
  pointer pvVar8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *pvVar9;
  long lVar10;
  pointer pdVar11;
  int k_1;
  pointer pvVar12;
  int d_1;
  int k_2;
  ulong uVar13;
  int v;
  int l;
  long lVar14;
  long lVar15;
  int k;
  ulong uVar16;
  double dVar17;
  value_type_conflict2 local_88;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ndkBuf;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  nkvBuf;
  
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&nkvBuf,((long)(this->_nkv).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->_nkv).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&ndkBuf
          );
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&ndkBuf,((long)(this->_ndk).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->_ndk).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x18,
           (allocator_type *)&local_88);
  lVar15 = 0;
  for (uVar16 = 0;
      uVar16 < (ulong)(((long)(this->_nkv).
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->_nkv).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar16 = uVar16 + 1
      ) {
    local_88 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              ((vector<double,_std::allocator<double>_> *)
               ((long)&((nkvBuf.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar15),(ulong)this->_V,&local_88);
    lVar15 = lVar15 + 0x18;
  }
  lVar15 = 0;
  for (uVar16 = 0;
      pvVar3 = (this->_ndk).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar16 < (ulong)(((long)(this->_ndk).
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18);
      uVar16 = uVar16 + 1) {
    local_88 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              ((vector<double,_std::allocator<double>_> *)
               ((long)&((ndkBuf.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar15),(ulong)this->_K,&local_88);
    lVar15 = lVar15 + 0x18;
  }
  pvVar4 = (this->_docVoca->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (this->_docVoca->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (lVar15 = 0; lVar15 != ((long)pvVar5 - (long)pvVar4) / 0x18; lVar15 = lVar15 + 1) {
    lVar6 = *(long *)&pvVar4[lVar15].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data;
    puVar7 = *(pointer *)
              ((long)&pvVar4[lVar15].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data + 8);
    uVar1 = this->_K;
    for (lVar14 = 0; lVar14 != (long)puVar7 - lVar6 >> 2; lVar14 = lVar14 + 1) {
      uVar13 = (ulong)*(uint *)(lVar6 + lVar14 * 4);
      pvVar8 = (this->_qz).
               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar9 = this->_frequencyMatrix;
      pvVar12 = nkvBuf.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      for (uVar16 = 0; uVar1 != uVar16; uVar16 = uVar16 + 1) {
        dVar17 = (double)*(uint *)(*(long *)&(pvVar9->
                                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start[lVar15].
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data + uVar13 * 4);
        lVar10 = *(long *)(*(long *)&pvVar8[lVar15].
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data + lVar14 * 0x18);
        pdVar11 = ndkBuf.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar15].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar11[uVar16] = *(double *)(lVar10 + uVar16 * 8) * dVar17 + pdVar11[uVar16];
        pdVar11 = (pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar11[uVar13] = dVar17 * *(double *)(lVar10 + uVar16 * 8) + pdVar11[uVar13];
        pvVar12 = pvVar12 + 1;
      }
    }
  }
  uVar1 = this->_K;
  uVar2 = this->_D;
  for (uVar16 = 0; uVar16 != uVar2; uVar16 = uVar16 + 1) {
    for (uVar13 = 0; uVar1 != uVar13; uVar13 = uVar13 + 1) {
      *(double *)
       (*(long *)&pvVar3[uVar16].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data + uVar13 * 8) =
           ndkBuf.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar16].
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar13];
    }
  }
  pdVar11 = (this->_nk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar2 = this->_V;
  for (uVar16 = 0; uVar16 != uVar1; uVar16 = uVar16 + 1) {
    pdVar11[uVar16] = 0.0;
    pvVar3 = (this->_nkv).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (uVar13 = 0; uVar2 != uVar13; uVar13 = uVar13 + 1) {
      dVar17 = nkvBuf.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16].
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar13];
      *(double *)
       (*(long *)&pvVar3[uVar16].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data + uVar13 * 8) = dVar17;
      pdVar11[uVar16] = dVar17 + pdVar11[uVar16];
    }
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&ndkBuf);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&nkvBuf);
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::updateNEx(){//{{{
    vector<vector<double> > nkvBuf(_nkv.size()), ndkBuf(_ndk.size());
    for(int k=0;k<_nkv.size();k++)nkvBuf[k].assign(_V, 0);
    for(int d=0;d<_ndk.size();d++)ndkBuf[d].assign(_K, 0);
    for(int d=0;d<_docVoca.size();d++){
        for(int l=0; l<_docVoca[d].size(); l++){
            unsigned int v = _docVoca[d][l];
            for(int k=0; k<_K; k++){
                ndkBuf[d][k] += _qz[d][l][k] * _frequencyMatrix[d][v];
                nkvBuf[k][v] += _qz[d][l][k] * _frequencyMatrix[d][v];
            }
        }
    }
    for(int d=0;d<_D;d++){
        for(int k=0;k<_K;k++){
            _ndk[d][k] = ndkBuf[d][k];
        }
    }
    for(int k=0;k<_K;k++){
        _nk[k] = 0;
        for(int v=0;v<_V;v++){
            _nkv[k][v] = nkvBuf[k][v];
            _nk[k] += nkvBuf[k][v];
        }
    }

}